

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_toFlushNow(ZSTD_CCtx *cctx)

{
  long in_RDI;
  ZSTDMT_CCtx *in_stack_00000028;
  undefined8 local_8;
  
  if (*(int *)(in_RDI + 300) < 1) {
    local_8 = 0;
  }
  else {
    local_8 = ZSTDMT_toFlushNow(in_stack_00000028);
  }
  return local_8;
}

Assistant:

size_t ZSTD_toFlushNow(ZSTD_CCtx* cctx)
{
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        return ZSTDMT_toFlushNow(cctx->mtctx);
    }
#endif
    (void)cctx;
    return 0;   /* over-simplification; could also check if context is currently running in streaming mode, and in which case, report how many bytes are left to be flushed within output buffer */
}